

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepImageLevel::moveSampleList
          (DeepImageLevel *this,size_t i,uint oldNumSamples,uint newNumSamples,
          size_t newSampleListPosition)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
  *in_RDI;
  undefined8 in_R8;
  iterator j;
  _Self local_28;
  undefined8 local_20;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
       ::begin(in_RDI);
  while( true ) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
              ::end(in_RDI);
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>
                           *)0x127b63);
    (*(ppVar2->second->super_ImageChannel)._vptr_ImageChannel[6])
              (ppVar2->second,local_10,(ulong)local_14,(ulong)local_18,local_20);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>
                  *)this_00._M_node);
  }
  return;
}

Assistant:

void
DeepImageLevel::moveSampleList (
    size_t       i,
    unsigned int oldNumSamples,
    unsigned int newNumSamples,
    size_t       newSampleListPosition)
{
    for (ChannelMap::iterator j = _channels.begin (); j != _channels.end ();
         ++j)
    {
        j->second->moveSampleList (
            i, oldNumSamples, newNumSamples, newSampleListPosition);
    }
}